

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbenchmarkvalgrind.cpp
# Opt level: O2

qint64 QBenchmarkValgrindUtils::extractResult(QString *fileName)

{
  longlong lVar1;
  char cVar2;
  bool bVar3;
  char *pcVar4;
  char *pcVar5;
  longlong *plVar6;
  long in_FS_OFFSET;
  QByteArrayView bv;
  __integer_from_chars_result_type<long_long> _Var7;
  qint64 v;
  undefined4 uStack_90;
  undefined8 uStack_8c;
  undefined4 local_84;
  char *local_80;
  QArrayDataPointer<char> local_78;
  undefined1 local_58 [16];
  qsizetype local_48;
  undefined1 *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QFile::QFile((QFile *)local_58,(QString *)fileName);
  QFile::open((QFile *)local_58,0x11);
  local_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_78.d = (Data *)0x0;
  local_78.ptr = (char *)0x0;
  local_78.size = 0;
  do {
    do {
      cVar2 = QIODevice::readLineInto((QByteArray *)local_58,(longlong)&local_78);
      if (cVar2 == '\0') {
        v._0_4_ = 2;
        local_84 = 0;
        v._4_4_ = 0;
        uStack_90 = 0;
        uStack_8c = 0;
        local_80 = "default";
        QMessageLogger::fatal((char *)&v,"Failed to extract result");
      }
      bv.m_data = "summary: ";
      bv.m_size = 9;
      bVar3 = QByteArray::startsWith((QByteArray *)&local_78,bv);
    } while (!bVar3);
    pcVar4 = QByteArray::data((QByteArray *)&local_78);
    pcVar5 = QByteArray::data((QByteArray *)&local_78);
    v._0_4_ = 0xaaaaaaaa;
    v._4_4_ = 0xaaaaaaaa;
    _Var7 = std::from_chars<long_long>(pcVar4 + 9,pcVar5 + local_78.size,&v,10);
  } while (_Var7.ec != 0);
  local_48 = CONCAT44(v._4_4_,(undefined4)v);
  local_40 = (undefined1 *)CONCAT71(local_40._1_7_,1);
  plVar6 = std::_Optional_base_impl<long_long,_std::_Optional_base<long_long,_true,_true>_>::_M_get
                     ((_Optional_base_impl<long_long,_std::_Optional_base<long_long,_true,_true>_> *
                      )&local_48);
  lVar1 = *plVar6;
  QArrayDataPointer<char>::~QArrayDataPointer(&local_78);
  QFile::~QFile((QFile *)local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return lVar1;
  }
  __stack_chk_fail();
}

Assistant:

qint64 QBenchmarkValgrindUtils::extractResult(const QString &fileName)
{
    QFile file(fileName);
    const bool openOk = file.open(QIODevice::ReadOnly | QIODevice::Text);
    Q_ASSERT(openOk);
    Q_UNUSED(openOk);

    std::optional<qint64> val = std::nullopt;
    QByteArray line;
    while (file.readLineInto(&line)) {
        constexpr QByteArrayView tag = "summary: ";
        if (line.startsWith(tag)) {
            const auto maybeNumber = line.data() + tag.size();
            const auto end = line.data() + line.size();
            qint64 v;
            const auto r = std::from_chars(maybeNumber, end, v);
            if (r.ec == std::errc{}) {
                val = v;
                break;
            }
        }
    }
    if (Q_UNLIKELY(!val))
        qFatal("Failed to extract result");
    return *val;
}